

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void load_circuit(Circuit *C,string *location,bool verbose)

{
  byte bVar1;
  ostream *poVar2;
  runtime_error *this;
  byte in_DL;
  string *in_RSI;
  ifstream inpf;
  undefined1 local_220 [168];
  Circuit *in_stack_fffffffffffffe88;
  istream *in_stack_fffffffffffffe90;
  
  if ((in_DL & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Loading circuit from location ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ifstream::ifstream(local_220,in_RSI,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    operator>>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::ifstream::close();
    if ((in_DL & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Finished loading circuit");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ifstream::~ifstream(local_220);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"file location");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_circuit(Circuit &C, const string &location, bool verbose = false) {
  if (verbose) {
    cout << "Loading circuit from location " << location << endl;
  }
  std::ifstream inpf(location);
  if (inpf.fail()) {
    throw std::runtime_error("file location");
  }
  inpf >> C;
  inpf.close();

  if (verbose) {
    cout << "Finished loading circuit" << endl;
  }
}